

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.c
# Opt level: O2

void fft_equalize(fft_window_data *data,void *user)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint32_t p;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_register_00001344 [12];
  
  uVar1 = (uint)data->framesize;
  pfVar2 = data->fft_workspace;
  for (uVar10 = 1; uVar7 = uVar10 - 1, uVar7 < uVar1; uVar10 = uVar10 + 2) {
    fVar12 = pfVar2[uVar7];
    fVar14 = pfVar2[uVar10];
    auVar15 = ZEXT416((uint)(fVar12 * fVar12 + fVar14 * fVar14));
    auVar15 = vsqrtss_avx(auVar15,auVar15);
    pfVar2[uVar7] = auVar15._0_4_ + auVar15._0_4_;
    fVar12 = atan2f(fVar14,fVar12);
    pfVar2[uVar10] = fVar12;
  }
  uVar10 = uVar1 >> 4;
  uVar11 = 1;
  for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 2) {
    uVar9 = (ulong)uVar7;
    auVar15._0_8_ = (double)((float)uVar9 / (float)uVar1);
    auVar15._8_8_ = in_register_00001344._4_8_;
    auVar15 = vsqrtsd_avx(auVar15,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = auVar15._0_8_ * (double)(uVar1 >> 1);
    auVar15 = vroundsd_avx(auVar16,auVar16,9);
    uVar3 = (ulong)(uint)(int)auVar15._0_8_ / (ulong)uVar10;
    iVar8 = (int)uVar3;
    uVar6 = uVar11;
    if (1 < iVar8) {
      uVar6 = uVar3;
    }
    uVar4 = 2;
    if (2 < iVar8) {
      uVar4 = uVar3;
    }
    iVar5 = 6;
    if (iVar8 < 6) {
      iVar5 = iVar8;
    }
    fVar12 = catmullrom((float)((uint)(int)auVar15._0_8_ % uVar10) / (float)uVar10,
                        *(float *)((long)user + uVar4 * 4 + 0x60),
                        *(float *)((long)user + uVar6 * 4 + 100),
                        *(float *)((long)user + (long)iVar8 * 4 + 0x68),
                        *(float *)((long)user + (long)iVar5 * 4 + 0x6c));
    pfVar2[uVar9] = fVar12 * pfVar2[uVar9];
  }
  for (; uVar10 = (int)uVar11 - 1, uVar10 < uVar1; uVar11 = (ulong)((int)uVar11 + 2)) {
    fVar12 = pfVar2[uVar10];
    fVar14 = pfVar2[uVar11];
    fVar13 = cosf(fVar14);
    pfVar2[uVar10] = fVar13 * fVar12;
    fVar14 = sinf(fVar14);
    pfVar2[uVar11] = fVar14 * fVar12;
  }
  return;
}

Assistant:

VECTORIZE void fft_equalize(struct fft_window_data *data, void *user){
  struct equalizer_segment_data *user_data = (struct equalizer_segment_data *)user;
  uint32_t framesize = data->framesize;
  float *fft_workspace = data->fft_workspace;
  float *bands = user_data->bands;

  // Change to mag/phase
  for(uint32_t i = 0; i < framesize; i+= 2){
    float re = fft_workspace[i+0];
    float im = fft_workspace[i+1];
    fft_workspace[i+0] = sqrtf(re * re + im * im) * 2;
    fft_workspace[i+1] = atan2f(im, re);
  }

  // Perform band eq
  for(uint32_t p = 0; p < framesize; p+= 2){
    int i = (int)floor(sqrt(p / (float)(framesize)) * (framesize / 2));
	int p2 = (i / (framesize / 16));
	int p1 = p2 - 1;
	int p0 = p1 - 1;
	int p3 = p2 + 1;
	if (p1 < 0) p1 = 0;
	if (p0 < 0) p0 = 0;
	if (p3 > 7) p3 = 7;
	float v = (float)(i % (framesize / 16)) / (float)(framesize / 16);
	fft_workspace[p] *= catmullrom(v, bands[p0], bands[p1], bands[p2], bands[p3]);
  }

  // Change back to complex
  for(uint32_t i = 0; i < framesize; i+= 2){
	float mag = fft_workspace[i+0];
	float pha = fft_workspace[i+1];
	fft_workspace[i+0] = cosf(pha) * mag;
	fft_workspace[i+1] = sinf(pha) * mag;
  }
}